

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_range_elements_base_vertex
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  bool bVar2;
  deBool dVar3;
  ContextType CVar4;
  ApiType AVar5;
  deUint32 program_00;
  RenderContext *pRVar6;
  NotSupportedError *this;
  mapped_type *this_00;
  char *local_3e0;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  StringTemplate local_2d8;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  StringTemplate local_270;
  string local_250;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram program;
  key_type local_88;
  undefined1 local_68 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLfloat vertices [1];
  GLuint fbo;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    pRVar6 = NegativeTestContext::getRenderContext(ctx);
    CVar4.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
    AVar5 = glu::ApiType::es(3,2);
    bVar2 = glu::contextSupports(CVar4,AVar5);
    if (!bVar2) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pRVar6 = NegativeTestContext::getRenderContext(ctx);
      CVar4.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
      AVar5 = glu::ApiType::es(3,2);
      bVar2 = glu::contextSupports(CVar4,AVar5);
      args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_68);
      if (bVar2) {
        local_3e0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
      }
      else {
        local_3e0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"GLSL_VERSION_STRING",
                 (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_68,&local_88);
      std::__cxx11::string::operator=((string *)this_00,local_3e0);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      pRVar6 = NegativeTestContext::getRenderContext(ctx);
      puVar1 = vertexShaderSource;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,puVar1,&local_291);
      tcu::StringTemplate::StringTemplate(&local_270,&local_290);
      tcu::StringTemplate::specialize
                (&local_250,&local_270,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_68);
      puVar1 = fragmentShaderSource;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,puVar1,&local_2f9);
      tcu::StringTemplate::StringTemplate(&local_2d8,&local_2f8);
      tcu::StringTemplate::specialize
                (&local_2b8,&local_2d8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_68);
      glu::makeVtxFragSources(&local_230,&local_250,&local_2b8);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar6,&local_230);
      glu::ProgramSources::~ProgramSources(&local_230);
      std::__cxx11::string::~string((string *)&local_2b8);
      tcu::StringTemplate::~StringTemplate(&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      std::__cxx11::string::~string((string *)&local_250);
      tcu::StringTemplate::~StringTemplate(&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
      glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
      NegativeTestContext::expectError(ctx,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,
                 "GL_INVALID_ENUM is generated if mode is not an accepted value.",&local_321);
      NegativeTestContext::beginSection(ctx,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0xffffffff,0,1,1,0x1401,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,
                 "GL_INVALID_ENUM is generated if type is not one of the accepted values.",
                 &local_349);
      NegativeTestContext::beginSection(ctx,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,0,1,1,0xffffffff,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x500);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,0,1,1,0x1406,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"GL_INVALID_VALUE is generated if count is negative.",
                 &local_371);
      NegativeTestContext::beginSection(ctx,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,0,1,-1,0x1401,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x501);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"GL_INVALID_VALUE is generated if end < start.",&local_399);
      NegativeTestContext::beginSection(ctx,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,1,0,1,0x1401,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x501);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,
                 "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
                 ,&local_3c1);
      NegativeTestContext::beginSection(ctx,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      glu::CallLogWrapper::glGenFramebuffers
                (&ctx->super_CallLogWrapper,1,
                 (GLuint *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      glu::CallLogWrapper::glBindFramebuffer
                (&ctx->super_CallLogWrapper,0x8d40,
                 args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
      glu::CallLogWrapper::glDrawRangeElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,0,1,1,0x1401,
                 &args._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      NegativeTestContext::expectError(ctx,0x506);
      glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
      glu::CallLogWrapper::glDeleteFramebuffers
                (&ctx->super_CallLogWrapper,1,
                 (GLuint *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      NegativeTestContext::endSection(ctx);
      glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_68);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a 3.2 context or higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeVertexArrayApiTests.cpp"
             ,0x527);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void draw_range_elements_base_vertex (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a 3.2 context or higher context version.");

	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	GLfloat						vertices[1];
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawRangeElementsBaseVertex(-1, 0, 1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, -1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if end < start.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 1, 0, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	ctx.glUseProgram(0);
}